

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O2

void __thiscall PixelToaster::UnixDisplay::defaults(UnixDisplay *this)

{
  (this->super_DisplayAdapter)._title[0] = '\0';
  (this->super_DisplayAdapter)._width = 0;
  (this->super_DisplayAdapter)._height = 0;
  (this->super_DisplayAdapter)._mode = FloatingPoint;
  (this->super_DisplayAdapter)._output = Default;
  (this->super_DisplayAdapter)._open = false;
  this->display_ = (Display *)0x0;
  this->window_ = 0;
  this->gc_ = (GC)0x0;
  this->image_ = (XImage *)0x0;
  DirtyVector<char>::reset(&this->buffer_,0);
  this->isShuttingDown_ = false;
  this->trueColorConverter_ = (Converter *)0x0;
  this->floatingPointConverter_ = (Converter *)0x0;
  return;
}

Assistant:

void defaults() override
    {
        DisplayAdapter::defaults();

        display_ = 0;
        window_  = 0;
        gc_      = 0;
        image_   = 0;
        buffer_.reset();
        trueColorConverter_     = 0;
        floatingPointConverter_ = 0;
        isShuttingDown_         = false;
        Format destFormat_      = Format::Unknown;
    }